

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void png_convert_from_time_t(png_timep ptime,time_t ttime)

{
  tm *ttime_00;
  tm *tbuf;
  time_t ttime_local;
  png_timep ptime_local;
  
  tbuf = (tm *)ttime;
  ttime_local = (time_t)ptime;
  ttime_00 = gmtime((time_t *)&tbuf);
  if (ttime_00 == (tm *)0x0) {
    memset((void *)ttime_local,0,8);
  }
  else {
    png_convert_from_struct_tm((png_timep)ttime_local,(tm *)ttime_00);
  }
  return;
}

Assistant:

void PNGAPI
png_convert_from_time_t(png_timep ptime, time_t ttime)
{
   struct tm *tbuf;

   png_debug(1, "in png_convert_from_time_t");

   tbuf = gmtime(&ttime);
   if (tbuf == NULL)
   {
      /* TODO: add a safe function which takes a png_ptr argument and raises
       * a png_error if the ttime argument is invalid and the call to gmtime
       * fails as a consequence.
       */
      memset(ptime, 0, sizeof(*ptime));
      return;
   }

   png_convert_from_struct_tm(ptime, tbuf);
}